

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O1

void __thiscall Js::CompoundString::Grow(CompoundString *this)

{
  Type *addr;
  Type *this_00;
  Block *pBVar1;
  code *pcVar2;
  bool bVar3;
  char16 *pcVar4;
  undefined4 *puVar5;
  Block *pBVar6;
  
  pcVar4 = JavascriptString::UnsafeGetBuffer((JavascriptString *)this);
  if (pcVar4 != (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x3b1,"(!IsFinalized())","!IsFinalized()");
    if (!bVar3) goto LAB_00b39557;
    *puVar5 = 0;
  }
  if (this->ownsLastBlock == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x3b2,"(OwnsLastBlock())","OwnsLastBlock()");
    if (!bVar3) {
LAB_00b39557:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  addr = &this->lastBlock;
  pBVar6 = (this->lastBlock).ptr;
  this_00 = &this->lastBlockInfo;
  if (pBVar6 == (Block *)0x0) {
    pBVar6 = BlockInfo::Resize(this_00,((((this->super_LiteralString).super_JavascriptString.
                                          super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
                                       ->recycler);
  }
  else {
    BlockInfo::CopyTo(this_00,pBVar6);
    pBVar6 = Block::Chain(pBVar6,((((this->super_LiteralString).super_JavascriptString.
                                    super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                                 recycler);
    pBVar1 = (pBVar6->bufferOwner).ptr;
    Memory::Recycler::WBSetBit((char *)this_00);
    (this->lastBlockInfo).buffer.ptr = pBVar1 + 1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(this_00);
    (this->lastBlockInfo).charLength = pBVar6->charLength;
    (this->lastBlockInfo).charCapacity = pBVar6->charCapacity;
  }
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = pBVar6;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  return;
}

Assistant:

void CompoundString::Grow()
    {
        Assert(!IsFinalized());
        Assert(OwnsLastBlock());

        Block *const lastBlock = this->lastBlock;
        if(!lastBlock)
        {
            // There is no last block. Only the buffer was allocated, and is held in 'lastBlockInfo'. In that case it is always
            // within the threshold to resize. Resize the buffer or resize it into a new block depending on its size.
            this->lastBlock = lastBlockInfo.Resize(GetLibrary()->GetRecycler());
            return;
        }

        lastBlockInfo.CopyTo(lastBlock);
        Block *const newLastBlock = lastBlock->Chain(GetLibrary()->GetRecycler());
        lastBlockInfo.CopyFrom(newLastBlock);
        this->lastBlock = newLastBlock;
    }